

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_1933e1::ConvolveTestBase::SpeedTest(ConvolveTestBase *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int64_t iVar7;
  ConvolveTestBase *in_RDI;
  int elapsed_time;
  RegisterStateCheckMMX reg_check_mmx_1;
  RegisterStateCheck reg_check_1;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int filter_y;
  int filter_x;
  int filter_bank;
  int tests_num;
  aom_usec_timer timer;
  InterpKernel *filters;
  InterpFilter filter;
  uint16_t r;
  int x;
  int y;
  ACMRandom prng;
  uint8_t *ref;
  uint8_t *out;
  uint8_t *in;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int16_t *in_stack_fffffffffffffec0;
  ConvolveFunc p_Var8;
  int16_t *in_stack_fffffffffffffec8;
  uint8_t *puVar9;
  undefined8 in_stack_fffffffffffffed0;
  uint8_t *puVar10;
  uint8_t *in_stack_fffffffffffffed8;
  int16_t *piVar11;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined8 in_stack_fffffffffffffef0;
  uint output_width;
  undefined8 in_stack_fffffffffffffef8;
  uint output_height;
  undefined8 in_stack_ffffffffffffff00;
  RegisterStateCheckMMX local_b2;
  RegisterStateCheckMMX local_86;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  aom_usec_timer local_58;
  int16_t *local_38;
  InterpFilter local_2f;
  uint16_t local_2e;
  int local_2c;
  int local_28;
  uint8_t *local_20;
  uint8_t *local_18;
  uint8_t *local_10;
  
  local_10 = input((ConvolveTestBase *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
                  );
  local_18 = output((ConvolveTestBase *)
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (in_RDI->UUT_->use_highbd_ == 0) {
    local_20 = (anonymous_namespace)::ConvolveTestBase::ref8_;
  }
  else {
    local_20 = (uint8_t *)((anonymous_namespace)::ConvolveTestBase::ref16_ >> 1);
  }
  libaom_test::ACMRandom::ACMRandom
            ((ACMRandom *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  local_28 = 0;
  while( true ) {
    iVar4 = local_28;
    iVar3 = Height((ConvolveTestBase *)0x449a2c);
    output_height = (uint)in_stack_ffffffffffffff00;
    output_width = (uint)in_stack_fffffffffffffef8;
    uVar6 = (uint)in_stack_fffffffffffffef0;
    uVar5 = (uint)((ulong)in_stack_fffffffffffffed0 >> 0x20);
    if (iVar3 <= iVar4) break;
    for (local_2c = 0; iVar4 = local_2c, iVar3 = Width((ConvolveTestBase *)0x449a63), iVar4 < iVar3;
        local_2c = local_2c + 1) {
      if ((in_RDI->UUT_->use_highbd_ == 0) || (in_RDI->UUT_->use_highbd_ == 8)) {
        bVar1 = libaom_test::ACMRandom::Rand8Extremes
                          ((ACMRandom *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        local_2e = (uint16_t)bVar1;
      }
      else {
        uVar2 = libaom_test::ACMRandom::Rand16
                          ((ACMRandom *)
                           CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        local_2e = uVar2 & (ushort)in_RDI->mask_;
      }
      assign_val(in_RDI,local_18,local_28 * 0x200 + local_2c,local_2e);
      assign_val(in_RDI,local_20,local_28 * 0x200 + local_2c,local_2e);
    }
    local_28 = local_28 + 1;
  }
  local_2f = EIGHTTAP_SMOOTH;
  local_38 = av1_get_interp_filter_kernel(EIGHTTAP_SMOOTH,3);
  Width((ConvolveTestBase *)0x449bd3);
  Height((ConvolveTestBase *)0x449be7);
  wrapper_filter_average_block2d_8_c
            ((ConvolveTestBase *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffed8,uVar5,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
             (uint8_t *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),uVar6,
             output_width,output_height);
  local_5c = 1000;
  ::aom_usec_timer_start((aom_usec_timer *)0x449c46);
  for (; 0 < local_5c; local_5c = local_5c + -1) {
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      local_2f = (InterpFilter)local_60;
      local_38 = av1_get_interp_filter_kernel(local_2f,3);
      for (local_64 = 0; local_64 < 0x10; local_64 = local_64 + 1) {
        for (local_68 = 0; local_68 < 0x10; local_68 = local_68 + 1) {
          if ((local_64 == 0) || (local_68 == 0)) {
            if (local_68 == 0) {
              if (local_64 != 0) {
                libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_b2);
                p_Var8 = in_RDI->UUT_->h8_;
                piVar11 = local_38 + (long)local_64 * 8;
                puVar9 = local_10;
                puVar10 = local_18;
                iVar4 = Width((ConvolveTestBase *)0x449e56);
                iVar3 = Height((ConvolveTestBase *)0x449e69);
                (*p_Var8)(puVar9,0x200,puVar10,0x200,piVar11,0x10,
                          (int16_t *)(anonymous_namespace)::kInvalidFilter,0x10,iVar4,iVar3);
                libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX
                          ((RegisterStateCheckMMX *)0x449ec6);
              }
            }
            else {
              libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_86);
              p_Var8 = in_RDI->UUT_->v8_;
              piVar11 = local_38 + (long)local_68 * 8;
              puVar9 = local_10;
              puVar10 = local_18;
              iVar4 = Width((ConvolveTestBase *)0x449d4d);
              iVar3 = Height((ConvolveTestBase *)0x449d60);
              (*p_Var8)(puVar9,0x200,puVar10,0x200,(int16_t *)(anonymous_namespace)::kInvalidFilter,
                        0x10,piVar11,0x10,iVar4,iVar3);
              libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX
                        ((RegisterStateCheckMMX *)0x449dbf);
            }
          }
        }
      }
    }
  }
  ::aom_usec_timer_mark((aom_usec_timer *)0x449f5b);
  iVar7 = ::aom_usec_timer_elapsed(&local_58);
  uVar5 = Width((ConvolveTestBase *)0x449f86);
  uVar6 = Height((ConvolveTestBase *)0x449f97);
  printf("%dx%d (bitdepth %d) time: %5d ms\n",(ulong)uVar5,(ulong)uVar6,
         (ulong)(uint)in_RDI->UUT_->use_highbd_,iVar7 / 1000 & 0xffffffff);
  return;
}

Assistant:

void SpeedTest() {
    uint8_t *const in = input();
    uint8_t *const out = output();
    uint8_t *ref;
    if (UUT_->use_highbd_ == 0) {
      ref = ref8_;
    } else {
      ref = CONVERT_TO_BYTEPTR(ref16_);
    }

    // Populate ref and out with some random data
    ::libaom_test::ACMRandom prng;
    for (int y = 0; y < Height(); ++y) {
      for (int x = 0; x < Width(); ++x) {
        uint16_t r;
        if (UUT_->use_highbd_ == 0 || UUT_->use_highbd_ == 8) {
          r = prng.Rand8Extremes();
        } else {
          r = prng.Rand16() & mask_;
        }
        assign_val(out, y * kOutputStride + x, r);
        assign_val(ref, y * kOutputStride + x, r);
      }
    }

    InterpFilter filter = (InterpFilter)1;
    const InterpKernel *filters =
        (const InterpKernel *)av1_get_interp_filter_kernel(filter, USE_8_TAPS);
    wrapper_filter_average_block2d_8_c(in, kInputStride, filters[1], filters[1],
                                       out, kOutputStride, Width(), Height());

    aom_usec_timer timer;
    int tests_num = 1000;

    aom_usec_timer_start(&timer);
    while (tests_num > 0) {
      for (int filter_bank = 0; filter_bank < kNumFilterBanks; ++filter_bank) {
        filter = (InterpFilter)filter_bank;
        filters = (const InterpKernel *)av1_get_interp_filter_kernel(
            filter, USE_8_TAPS);
        for (int filter_x = 0; filter_x < kNumFilters; ++filter_x) {
          for (int filter_y = 0; filter_y < kNumFilters; ++filter_y) {
            if (filter_x && filter_y) continue;
            if (filter_y)
              API_REGISTER_STATE_CHECK(UUT_->v8_(
                  in, kInputStride, out, kOutputStride, kInvalidFilter, 16,
                  filters[filter_y], 16, Width(), Height()));
            else if (filter_x)
              API_REGISTER_STATE_CHECK(UUT_->h8_(
                  in, kInputStride, out, kOutputStride, filters[filter_x], 16,
                  kInvalidFilter, 16, Width(), Height()));
          }
        }
      }
      tests_num--;
    }
    aom_usec_timer_mark(&timer);

    const int elapsed_time =
        static_cast<int>(aom_usec_timer_elapsed(&timer) / 1000);
    printf("%dx%d (bitdepth %d) time: %5d ms\n", Width(), Height(),
           UUT_->use_highbd_, elapsed_time);
  }